

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError checkpasswd(char *kind,char **userpwd)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *passptr;
  size_t userlen;
  size_t passwdlen;
  char prompt [256];
  char passwd [256];
  char *ptr;
  char **userpwd_local;
  char *kind_local;
  
  if ((*userpwd != (char *)0x0) && (pcVar1 = strchr(*userpwd,0x3a), pcVar1 == (char *)0x0)) {
    memset(prompt + 0xf8,0,0x100);
    sVar2 = strlen(*userpwd);
    curl_msnprintf(&passwdlen,0x100,"Enter %s password for user \'%s\':",kind,*userpwd);
    getpass_r((char *)&passwdlen,prompt + 0xf8,0x100);
    sVar3 = strlen(prompt + 0xf8);
    pcVar1 = (char *)realloc(*userpwd,sVar3 + sVar2 + 2);
    if (pcVar1 == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    pcVar1[sVar2] = ':';
    memcpy(pcVar1 + sVar2 + 1,prompt + 0xf8,sVar3 + 1);
    *userpwd = pcVar1;
  }
  return PARAM_OK;
}

Assistant:

ParameterError checkpasswd(const char *kind, /* for what purpose */
                           char **userpwd)   /* pointer to allocated string */
{
  char *ptr;

  if(!*userpwd)
    return PARAM_OK;

  ptr = strchr(*userpwd, ':');
  if(!ptr) {
    /* no password present, prompt for one */
    char passwd[256] = "";
    char prompt[256];
    size_t passwdlen;
    size_t userlen = strlen(*userpwd);
    char *passptr;

    /* build a nice-looking prompt */
    curlx_msnprintf(prompt, sizeof(prompt),
                    "Enter %s password for user '%s':",
                    kind, *userpwd);

    /* get password */
    getpass_r(prompt, passwd, sizeof(passwd));
    passwdlen = strlen(passwd);

    /* extend the allocated memory area to fit the password too */
    passptr = realloc(*userpwd,
                      passwdlen + 1 + /* an extra for the colon */
                      userlen + 1);   /* an extra for the zero */
    if(!passptr)
      return PARAM_NO_MEM;

    /* append the password separated with a colon */
    passptr[userlen] = ':';
    memcpy(&passptr[userlen+1], passwd, passwdlen+1);
    *userpwd = passptr;
  }
  return PARAM_OK;
}